

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul>>
::
FlatTupleBase<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>
          (FlatTupleBase<testing::internal::FlatTuple<std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>,std::tuple<long,long>>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul>>
           *this,undefined8 *param_2,undefined8 *param_3,undefined8 *param_4,undefined8 *param_5,
          undefined8 *param_6,undefined8 *param_7,undefined8 *param_8,undefined8 *param_9,
          undefined8 *param_10)

{
  *(undefined8 *)this = *param_2;
  *(undefined8 *)(this + 8) = param_2[1];
  *(undefined8 *)(this + 0x10) = *param_3;
  *(undefined8 *)(this + 0x18) = param_3[1];
  *(undefined8 *)(this + 0x20) = *param_4;
  *(undefined8 *)(this + 0x28) = param_4[1];
  *(undefined8 *)(this + 0x30) = *param_5;
  *(undefined8 *)(this + 0x38) = param_5[1];
  *(undefined8 *)(this + 0x40) = *param_6;
  *(undefined8 *)(this + 0x48) = param_6[1];
  *(undefined8 *)(this + 0x50) = *param_7;
  *(undefined8 *)(this + 0x58) = param_7[1];
  *(undefined8 *)(this + 0x60) = *param_8;
  *(undefined8 *)(this + 0x68) = param_8[1];
  *(undefined8 *)(this + 0x70) = *param_9;
  *(undefined8 *)(this + 0x78) = param_9[1];
  *(undefined8 *)(this + 0x80) = *param_10;
  *(undefined8 *)(this + 0x88) = param_10[1];
  return;
}

Assistant:

explicit FlatTupleBase(FlatTupleConstructTag, Args&&... args)
      : FlatTupleElemBase<FlatTuple<T...>, Idx>(FlatTupleConstructTag{},
                                                std::forward<Args>(args))... {}